

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O2

void __thiscall GetAllUsersRequest::GetAllUsersRequest(GetAllUsersRequest *this,Event *e)

{
  EventNotValid *this_00;
  bool bVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  keysToBeInEvent;
  allocator local_69;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_68,e);
  std::__cxx11::string::string((string *)&local_58,"type",&local_69);
  keysToBeInEvent._M_len = 1;
  keysToBeInEvent._M_array = &local_58;
  bVar1 = checkEventKeys(&local_68,keysToBeInEvent);
  std::__cxx11::string::~string((string *)&local_58);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_68);
  if (bVar1) {
    return;
  }
  this_00 = (EventNotValid *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,"Improper GET_ALL_USERS_REQUEST",(allocator *)&local_58);
  EventNotValid::EventNotValid(this_00,&local_38);
  __cxa_throw(this_00,&EventNotValid::typeinfo,EventError::~EventError);
}

Assistant:

explicit GetAllUsersRequest(Event e){
	  if(!checkEventKeys(e, {"type"})) {
		  throw EventNotValid("Improper GET_ALL_USERS_REQUEST");
	  }
  }